

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O2

Clifford * operator*(Clifford *__return_storage_ptr__,float tv,Clifford *A)

{
  pointer pBVar1;
  Blade local_40;
  float local_38;
  
  (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38 = tv;
  if (ABS(tv) <= 1e-06) {
    Blade::Blade(&local_40);
    std::vector<Blade,_std::allocator<Blade>_>::emplace_back<Blade>
              (__return_storage_ptr__,&local_40);
    Blade::~Blade(&local_40);
  }
  else {
    for (pBVar1 = (A->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        pBVar1 != (A->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
                  super__Vector_impl_data._M_finish; pBVar1 = pBVar1 + 1) {
      Blade::Blade(&local_40,pBVar1->mBase,pBVar1->mVal * local_38);
      std::vector<Blade,_std::allocator<Blade>_>::emplace_back<Blade>
                (__return_storage_ptr__,&local_40);
      Blade::~Blade(&local_40);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Clifford operator*(float tv, Clifford A)
{
	Clifford R;
	idx a=A.begin();
	if(fabs(tv)>Error2)
	{
		while(a!=A.end())
		{	
		R.push_back(Blade(a->mBase,tv*a->mVal));
		a++;
		}
	return R;
	}
	else
	{
	R.push_back(Blade());
	}
	return R;
}